

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.c
# Opt level: O0

int dwarf_expand_frame_instructions
              (Dwarf_Cie_conflict cie,Dwarf_Small *instruction,Dwarf_Unsigned i_length,
              Dwarf_Frame_Instr_Head *returned_instr_head,Dwarf_Unsigned *returned_instr_count,
              Dwarf_Error *error)

{
  Dwarf_Debug dbg_00;
  Dwarf_Small *instr_end;
  Dwarf_Small *instr_start;
  Dwarf_Debug dbg;
  int res;
  Dwarf_Error *error_local;
  Dwarf_Unsigned *returned_instr_count_local;
  Dwarf_Frame_Instr_Head *returned_instr_head_local;
  Dwarf_Unsigned i_length_local;
  Dwarf_Small *instruction_local;
  Dwarf_Cie_conflict cie_local;
  
  if (cie == (Dwarf_Cie_conflict)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x51);
    cie_local._4_4_ = 1;
  }
  else {
    dbg_00 = cie->ci_dbg;
    if ((returned_instr_head == (Dwarf_Frame_Instr_Head *)0x0) ||
       (returned_instr_count == (Dwarf_Unsigned *)0x0)) {
      _dwarf_error_string(dbg_00,error,0x65,
                          "DW_DLE_RET_OP_LIST_NULL: Calling dwarf_expand_frame_instructions without a non-NULL Dwarf_Frame_Instr_Head pointer and count pointer seems wrong."
                         );
      cie_local._4_4_ = 1;
    }
    else if (instruction + i_length < instruction) {
      _dwarf_error(dbg_00,error,0x154);
      cie_local._4_4_ = 1;
    }
    else {
      cie_local._4_4_ =
           _dwarf_exec_frame_instr
                     (1,0,0,0,instruction,instruction + i_length,(Dwarf_Frame)0x0,cie,dbg_00,
                      dbg_00->de_frame_cfa_col_number,(Dwarf_Bool *)0x0,(Dwarf_Addr *)0x0,
                      returned_instr_head,returned_instr_count,error);
      if (cie_local._4_4_ == 0) {
        cie_local._4_4_ = 0;
      }
    }
  }
  return cie_local._4_4_;
}

Assistant:

int
dwarf_expand_frame_instructions(Dwarf_Cie cie,
    Dwarf_Small   *instruction,
    Dwarf_Unsigned i_length,
    Dwarf_Frame_Instr_Head * returned_instr_head,
    Dwarf_Unsigned * returned_instr_count,
    Dwarf_Error * error)
{
    int res = DW_DLV_ERROR;
    Dwarf_Debug dbg = 0;
    Dwarf_Small * instr_start = instruction;
    Dwarf_Small * instr_end = (Dwarf_Small *)instruction + i_length;;

    if (cie == 0) {
        _dwarf_error(NULL, error, DW_DLE_DBG_NULL);
        return DW_DLV_ERROR;
    }
    dbg = cie->ci_dbg;

    if (!returned_instr_head  || !returned_instr_count) {
        _dwarf_error_string(dbg, error, DW_DLE_RET_OP_LIST_NULL,
            "DW_DLE_RET_OP_LIST_NULL: "
            "Calling dwarf_expand_frame_instructions without "
            "a non-NULL Dwarf_Frame_Instr_Head pointer and "
            "count pointer seems wrong.");
        return DW_DLV_ERROR;
    }
    if ( instr_end < instr_start) {
        /*  Impossible unless there was wraparond somewhere and
            we missed it. */
        _dwarf_error(dbg, error,DW_DLE_FDE_INSTR_PTR_ERROR);
        return DW_DLV_ERROR;
    }
    res = _dwarf_exec_frame_instr( /* make_instr= */ TRUE,
        /* search_pc */ FALSE,
        /* search_pc_val */ 0,
        /* location */ 0,
        instr_start,
        instr_end,
        /* Dwarf_Frame */ NULL,
        cie,
        dbg,
        dbg->de_frame_cfa_col_number,
        /* has more rows */0,
        /* subsequent_pc */0,
        returned_instr_head,
        returned_instr_count,
        error);
    if (res != DW_DLV_OK) {
        return res;
    }
    return DW_DLV_OK;
}